

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miam-core.c
# Opt level: O0

la_proto_node * la_miam_core_v1_ack_parse(uint8_t *hdrbuf,int hdrlen,uint8_t *bodybuf,int bodylen)

{
  void *pvVar1;
  la_proto_node *plVar2;
  int in_ESI;
  long in_RDI;
  la_proto_node *node;
  la_miam_core_v1_ack_pdu *pdu;
  undefined4 in_stack_00000028;
  
  pvVar1 = la_xcalloc((size_t)hdrbuf,CONCAT44(hdrlen,in_stack_00000028),(char *)bodybuf,bodylen,
                      (char *)pdu);
  plVar2 = la_proto_node_new();
  plVar2->td = &la_DEF_miam_core_v1_ack_pdu;
  plVar2->data = pvVar1;
  plVar2->next = (la_proto_node *)0x0;
  if (in_ESI < 0x14) {
    *(uint *)((long)pvVar1 + 8) = *(uint *)((long)pvVar1 + 8) | 8;
  }
  else {
    *(uint *)((long)pvVar1 + 0xc) =
         (uint)*(byte *)(in_RDI + 1) << 0x10 | (uint)*(byte *)(in_RDI + 2) << 8 |
         (uint)*(byte *)(in_RDI + 3);
    *(undefined4 *)((long)pvVar1 + 0x14) = *(undefined4 *)(in_RDI + 4);
    *(undefined2 *)((long)pvVar1 + 0x18) = *(undefined2 *)(in_RDI + 8);
    *(undefined1 *)((long)pvVar1 + 0x1a) = *(undefined1 *)(in_RDI + 10);
    *(undefined1 *)((long)pvVar1 + 0x1b) = 0;
    *(char *)((long)pvVar1 + 0x1c) = (char)((int)(uint)*(byte *)(in_RDI + 0xb) >> 1);
    *(char *)((long)pvVar1 + 0x1d) = (char)((int)(uint)*(byte *)(in_RDI + 0xc) >> 4);
    *(undefined4 *)((long)pvVar1 + 0x1e) = *(undefined4 *)(in_RDI + 0x10);
  }
  return plVar2;
}

Assistant:

static la_proto_node *la_miam_core_v1_ack_parse(uint8_t const *hdrbuf, int hdrlen, uint8_t const *bodybuf, int bodylen) {
	la_assert(hdrbuf != NULL);
	LA_UNUSED(bodybuf);
	LA_UNUSED(bodylen);

	LA_NEW(la_miam_core_v1_ack_pdu, pdu);
	la_proto_node *node = la_proto_node_new();
	node->td = &la_DEF_miam_core_v1_ack_pdu;
	node->data = pdu;
	node->next = NULL;

	if(hdrlen < 20) {
		la_debug_print(D_ERROR, "Header too short: %d < 20\n", hdrlen);
		pdu->err |= LA_MIAM_ERR_HDR_TRUNCATED;
		goto end;
	}

	pdu->pdu_len = (hdrbuf[1] << 16) | (hdrbuf[2] << 8) | hdrbuf[3];
	hdrbuf += 4; hdrlen -=4;

	memcpy(&pdu->aircraft_id, hdrbuf, 7);
	pdu->aircraft_id[7] = '\0';
	la_debug_print(D_INFO, "len: %u aircraft_id: %s\n", pdu->pdu_len, pdu->aircraft_id);
	hdrbuf += 7; hdrlen -= 7;

	pdu->msg_ack_num = (hdrbuf[0] >> 1) & 0x7f;
	hdrbuf++; hdrlen--;

	pdu->ack_xfer_result = (hdrbuf[0] >> 4) & 0xf;
	la_debug_print(D_INFO, "msg_ack_num: %u ack_xfer_result: 0x%x\n", pdu->msg_ack_num, pdu->ack_xfer_result);
	hdrbuf += 4; hdrlen -= 4;

	memcpy(pdu->crc, hdrbuf, LA_MIAM_CORE_V1_CRC_LEN);
	hdrbuf += LA_MIAM_CORE_V1_CRC_LEN; hdrlen -= LA_MIAM_CORE_V1_CRC_LEN;
	if(hdrlen > 0) {
		la_debug_print(D_ERROR, "Warning: %u bytes left after MIAM header\n", hdrlen);
	}
end:
	return node;
}